

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O3

ngram_model_set_iter_t * ngram_model_set_iter(ngram_model_t *base)

{
  ngram_model_set_iter_t *pnVar1;
  ngram_model_set_t *set;
  
  if (base != (ngram_model_t *)0x0) {
    if (base[1].refcount == 0) {
      pnVar1 = (ngram_model_set_iter_t *)0x0;
    }
    else {
      pnVar1 = (ngram_model_set_iter_t *)
               __ckd_calloc__(1,0x10,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                              ,0x17f);
      pnVar1->set = (ngram_model_set_t *)base;
    }
    return pnVar1;
  }
  return (ngram_model_set_iter_t *)0x0;
}

Assistant:

ngram_model_set_iter_t *
ngram_model_set_iter(ngram_model_t * base)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    ngram_model_set_iter_t *itor;

    if (set == NULL || set->n_models == 0)
        return NULL;
    itor = ckd_calloc(1, sizeof(*itor));
    itor->set = set;
    return itor;
}